

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int whereLoopAddVirtualOne
              (WhereLoopBuilder *pBuilder,Bitmask mPrereq,Bitmask mUsable,u16 mExclude,
              sqlite3_index_info *pIdxInfo,u16 mNoOmit,int *pbIn,int *pbRetryLimit)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  WhereClause *pWVar4;
  sqlite3_index_constraint_usage *aUsage;
  WhereLoop *pTemplate;
  Parse *pParse_00;
  SrcList *pSVar5;
  LogEst LVar6;
  int iVar7;
  WhereTerm *pWVar8;
  i8 local_b4;
  uint local_b0;
  int j;
  WhereTerm *pTerm_1;
  int iTerm;
  WhereTerm *pTerm;
  int nConstraint;
  SrcItem *pSrc;
  Parse *pParse;
  WhereLoop *pNew;
  int local_68;
  int rc;
  int mxTerm;
  int i;
  sqlite3_index_constraint_usage *pUsage;
  sqlite3_index_constraint *pIdxCons;
  HiddenIndexInfo *pHidden;
  WhereClause *pWC;
  u16 mNoOmit_local;
  sqlite3_index_info *pIdxInfo_local;
  u16 mExclude_local;
  Bitmask mUsable_local;
  Bitmask mPrereq_local;
  WhereLoopBuilder *pBuilder_local;
  
  pWVar4 = pBuilder->pWC;
  aUsage = pIdxInfo->aConstraintUsage;
  pTemplate = pBuilder->pNew;
  pParse_00 = pBuilder->pWInfo->pParse;
  pSVar5 = pBuilder->pWInfo->pTabList;
  bVar1 = pTemplate->iTab;
  iVar2 = pIdxInfo->nConstraint;
  *pbIn = 0;
  pTemplate->prereq = mPrereq;
  pUsage = (sqlite3_index_constraint_usage *)pIdxInfo->aConstraint;
  for (rc = 0; rc < iVar2; rc = rc + 1) {
    pWVar8 = pWVar4->a + pUsage[1].argvIndex;
    pUsage->field_0x5 = 0;
    if ((((pWVar8->prereqRight & mUsable) == pWVar8->prereqRight) &&
        ((pWVar8->eOperator & mExclude) == 0)) &&
       ((pbRetryLimit != (int *)0x0 || (iVar7 = isLimitTerm(pWVar8), iVar7 == 0)))) {
      pUsage->field_0x5 = 1;
    }
    pUsage = (sqlite3_index_constraint_usage *)&pUsage[1].omit;
  }
  memset(aUsage,0,(long)iVar2 << 3);
  pIdxInfo->idxStr = (char *)0x0;
  pIdxInfo->idxNum = 0;
  pIdxInfo->orderByConsumed = 0;
  pIdxInfo->estimatedCost = 5e+98;
  pIdxInfo->estimatedRows = 0x19;
  pIdxInfo->idxFlags = 0;
  pIdxInfo->colUsed = pSVar5->a[bVar1].colUsed;
  *(undefined4 *)&pIdxInfo[1].aOrderBy = 0;
  pBuilder_local._4_4_ = vtabBestIndex(pParse_00,pSVar5->a[bVar1].pTab,pIdxInfo);
  if (pBuilder_local._4_4_ == 0) {
    local_68 = -1;
    memset(pTemplate->aLTerm,0,(long)iVar2 << 3);
    memset(&pTemplate->u,0,0x18);
    pUsage = (sqlite3_index_constraint_usage *)pIdxInfo->aConstraint;
    for (rc = 0; rc < iVar2; rc = rc + 1) {
      iVar7 = aUsage[rc].argvIndex + -1;
      if (-1 < iVar7) {
        iVar3 = pUsage[1].argvIndex;
        if ((((iVar2 <= iVar7) || (iVar3 < 0)) || (pWVar4->nTerm <= iVar3)) ||
           ((pTemplate->aLTerm[iVar7] != (WhereTerm *)0x0 || (pUsage->field_0x5 == '\0')))) {
          sqlite3ErrorMsg(pParse_00,"%s.xBestIndex malfunction",(pSVar5->a[bVar1].pTab)->zName);
          return 1;
        }
        pWVar8 = pWVar4->a + iVar3;
        pTemplate->prereq = pWVar8->prereqRight | pTemplate->prereq;
        pTemplate->aLTerm[iVar7] = pWVar8;
        if (local_68 < iVar7) {
          local_68 = iVar7;
        }
        if (aUsage[rc].omit != '\0') {
          if ((rc < 0x10) && ((1 << ((byte)rc & 0x1f) & (uint)mNoOmit) == 0)) {
            (pTemplate->u).btree.nDistinctCol =
                 (pTemplate->u).btree.nDistinctCol | (ushort)(1 << ((byte)iVar7 & 0x1f));
          }
          if (pWVar8->eMatchOp == 'J') {
            *(byte *)((long)&pTemplate->u + 4) = *(byte *)((long)&pTemplate->u + 4) & 0xfd | 2;
          }
        }
        if (rc < 0x20) {
          local_b0 = 1 << ((byte)rc & 0x1f);
        }
        else {
          local_b0 = 0;
        }
        if ((local_b0 & *(uint *)&pIdxInfo[1].aOrderBy) == 0) {
          if ((pWVar8->eOperator & 1) != 0) {
            pIdxInfo->orderByConsumed = 0;
            pIdxInfo->idxFlags = pIdxInfo->idxFlags & 0xfffffffe;
            *pbIn = 1;
          }
        }
        else {
          (pTemplate->u).vtab.mHandleIn = 1 << ((byte)iVar7 & 0x1f) | (pTemplate->u).vtab.mHandleIn;
        }
        iVar7 = isLimitTerm(pWVar8);
        if ((iVar7 != 0) && ((*pbIn != 0 || (iVar7 = allConstraintsUsed(aUsage,rc), iVar7 == 0)))) {
          if (pIdxInfo->needToFreeIdxStr != 0) {
            sqlite3_free(pIdxInfo->idxStr);
            pIdxInfo->idxStr = (char *)0x0;
            pIdxInfo->needToFreeIdxStr = 0;
          }
          *pbRetryLimit = 1;
          return 0;
        }
      }
      pUsage = (sqlite3_index_constraint_usage *)&pUsage[1].omit;
    }
    pTemplate->nLTerm = (short)local_68 + 1;
    for (rc = 0; rc <= local_68; rc = rc + 1) {
      if (pTemplate->aLTerm[rc] == (WhereTerm *)0x0) {
        sqlite3ErrorMsg(pParse_00,"%s.xBestIndex malfunction",(pSVar5->a[bVar1].pTab)->zName);
        return 1;
      }
    }
    (pTemplate->u).vtab.idxNum = pIdxInfo->idxNum;
    *(byte *)((long)&pTemplate->u + 4) =
         *(byte *)((long)&pTemplate->u + 4) & 0xfe | (byte)pIdxInfo->needToFreeIdxStr & 1;
    pIdxInfo->needToFreeIdxStr = 0;
    (pTemplate->u).btree.pIndex = (Index *)pIdxInfo->idxStr;
    if (pIdxInfo->orderByConsumed == 0) {
      local_b4 = '\0';
    }
    else {
      local_b4 = (i8)pIdxInfo->nOrderBy;
    }
    (pTemplate->u).vtab.isOrdered = local_b4;
    pTemplate->rSetup = 0;
    LVar6 = sqlite3LogEstFromDouble(pIdxInfo->estimatedCost);
    pTemplate->rRun = LVar6;
    LVar6 = sqlite3LogEst(pIdxInfo->estimatedRows);
    pTemplate->nOut = LVar6;
    if ((pIdxInfo->idxFlags & 1U) == 0) {
      pTemplate->wsFlags = pTemplate->wsFlags & 0xffffefff;
    }
    else {
      pTemplate->wsFlags = pTemplate->wsFlags | 0x1000;
    }
    pBuilder_local._4_4_ = whereLoopInsert(pBuilder,pTemplate);
    if ((undefined1  [24])((undefined1  [24])pTemplate->u & (undefined1  [24])0x100000000) !=
        (undefined1  [24])0x0) {
      sqlite3_free((pTemplate->u).btree.pIndex);
      *(byte *)((long)&pTemplate->u + 4) = *(byte *)((long)&pTemplate->u + 4) & 0xfe;
    }
  }
  else if (pBuilder_local._4_4_ == 0x13) {
    pBuilder_local._4_4_ = 0;
  }
  return pBuilder_local._4_4_;
}

Assistant:

static int whereLoopAddVirtualOne(
  WhereLoopBuilder *pBuilder,
  Bitmask mPrereq,                /* Mask of tables that must be used. */
  Bitmask mUsable,                /* Mask of usable tables */
  u16 mExclude,                   /* Exclude terms using these operators */
  sqlite3_index_info *pIdxInfo,   /* Populated object for xBestIndex */
  u16 mNoOmit,                    /* Do not omit these constraints */
  int *pbIn,                      /* OUT: True if plan uses an IN(...) op */
  int *pbRetryLimit               /* OUT: Retry without LIMIT/OFFSET */
){
  WhereClause *pWC = pBuilder->pWC;
  HiddenIndexInfo *pHidden = (HiddenIndexInfo*)&pIdxInfo[1];
  struct sqlite3_index_constraint *pIdxCons;
  struct sqlite3_index_constraint_usage *pUsage = pIdxInfo->aConstraintUsage;
  int i;
  int mxTerm;
  int rc = SQLITE_OK;
  WhereLoop *pNew = pBuilder->pNew;
  Parse *pParse = pBuilder->pWInfo->pParse;
  SrcItem *pSrc = &pBuilder->pWInfo->pTabList->a[pNew->iTab];
  int nConstraint = pIdxInfo->nConstraint;

  assert( (mUsable & mPrereq)==mPrereq );
  *pbIn = 0;
  pNew->prereq = mPrereq;

  /* Set the usable flag on the subset of constraints identified by
  ** arguments mUsable and mExclude. */
  pIdxCons = *(struct sqlite3_index_constraint**)&pIdxInfo->aConstraint;
  for(i=0; i<nConstraint; i++, pIdxCons++){
    WhereTerm *pTerm = &pWC->a[pIdxCons->iTermOffset];
    pIdxCons->usable = 0;
    if( (pTerm->prereqRight & mUsable)==pTerm->prereqRight
     && (pTerm->eOperator & mExclude)==0
     && (pbRetryLimit || !isLimitTerm(pTerm))
    ){
      pIdxCons->usable = 1;
    }
  }

  /* Initialize the output fields of the sqlite3_index_info structure */
  memset(pUsage, 0, sizeof(pUsage[0])*nConstraint);
  assert( pIdxInfo->needToFreeIdxStr==0 );
  pIdxInfo->idxStr = 0;
  pIdxInfo->idxNum = 0;
  pIdxInfo->orderByConsumed = 0;
  pIdxInfo->estimatedCost = SQLITE_BIG_DBL / (double)2;
  pIdxInfo->estimatedRows = 25;
  pIdxInfo->idxFlags = 0;
  pIdxInfo->colUsed = (sqlite3_int64)pSrc->colUsed;
  pHidden->mHandleIn = 0;

  /* Invoke the virtual table xBestIndex() method */
  rc = vtabBestIndex(pParse, pSrc->pTab, pIdxInfo);
  if( rc ){
    if( rc==SQLITE_CONSTRAINT ){
      /* If the xBestIndex method returns SQLITE_CONSTRAINT, that means
      ** that the particular combination of parameters provided is unusable.
      ** Make no entries in the loop table.
      */
      WHERETRACE(0xffffffff, ("  ^^^^--- non-viable plan rejected!\n"));
      return SQLITE_OK;
    }
    return rc;
  }

  mxTerm = -1;
  assert( pNew->nLSlot>=nConstraint );
  memset(pNew->aLTerm, 0, sizeof(pNew->aLTerm[0])*nConstraint );
  memset(&pNew->u.vtab, 0, sizeof(pNew->u.vtab));
  pIdxCons = *(struct sqlite3_index_constraint**)&pIdxInfo->aConstraint;
  for(i=0; i<nConstraint; i++, pIdxCons++){
    int iTerm;
    if( (iTerm = pUsage[i].argvIndex - 1)>=0 ){
      WhereTerm *pTerm;
      int j = pIdxCons->iTermOffset;
      if( iTerm>=nConstraint
       || j<0
       || j>=pWC->nTerm
       || pNew->aLTerm[iTerm]!=0
       || pIdxCons->usable==0
      ){
        sqlite3ErrorMsg(pParse,"%s.xBestIndex malfunction",pSrc->pTab->zName);
        testcase( pIdxInfo->needToFreeIdxStr );
        return SQLITE_ERROR;
      }
      testcase( iTerm==nConstraint-1 );
      testcase( j==0 );
      testcase( j==pWC->nTerm-1 );
      pTerm = &pWC->a[j];
      pNew->prereq |= pTerm->prereqRight;
      assert( iTerm<pNew->nLSlot );
      pNew->aLTerm[iTerm] = pTerm;
      if( iTerm>mxTerm ) mxTerm = iTerm;
      testcase( iTerm==15 );
      testcase( iTerm==16 );
      if( pUsage[i].omit ){
        if( i<16 && ((1<<i)&mNoOmit)==0 ){
          testcase( i!=iTerm );
          pNew->u.vtab.omitMask |= 1<<iTerm;
        }else{
          testcase( i!=iTerm );
        }
        if( pTerm->eMatchOp==SQLITE_INDEX_CONSTRAINT_OFFSET ){
          pNew->u.vtab.bOmitOffset = 1;
        }
      }
      if( SMASKBIT32(i) & pHidden->mHandleIn ){
        pNew->u.vtab.mHandleIn |= MASKBIT32(iTerm);
      }else if( (pTerm->eOperator & WO_IN)!=0 ){
        /* A virtual table that is constrained by an IN clause may not
        ** consume the ORDER BY clause because (1) the order of IN terms
        ** is not necessarily related to the order of output terms and
        ** (2) Multiple outputs from a single IN value will not merge
        ** together.  */
        pIdxInfo->orderByConsumed = 0;
        pIdxInfo->idxFlags &= ~SQLITE_INDEX_SCAN_UNIQUE;
        *pbIn = 1; assert( (mExclude & WO_IN)==0 );
      }

      /* Unless pbRetryLimit is non-NULL, there should be no LIMIT/OFFSET
      ** terms. And if there are any, they should follow all other terms. */
      assert( pbRetryLimit || !isLimitTerm(pTerm) );
      assert( !isLimitTerm(pTerm) || i>=nConstraint-2 );
      assert( !isLimitTerm(pTerm) || i==nConstraint-1 || isLimitTerm(pTerm+1) );

      if( isLimitTerm(pTerm) && (*pbIn || !allConstraintsUsed(pUsage, i)) ){
        /* If there is an IN(...) term handled as an == (separate call to
        ** xFilter for each value on the RHS of the IN) and a LIMIT or
        ** OFFSET term handled as well, the plan is unusable. Similarly,
        ** if there is a LIMIT/OFFSET and there are other unused terms,
        ** the plan cannot be used. In these cases set variable *pbRetryLimit
        ** to true to tell the caller to retry with LIMIT and OFFSET
        ** disabled. */
        if( pIdxInfo->needToFreeIdxStr ){
          sqlite3_free(pIdxInfo->idxStr);
          pIdxInfo->idxStr = 0;
          pIdxInfo->needToFreeIdxStr = 0;
        }
        *pbRetryLimit = 1;
        return SQLITE_OK;
      }
    }
  }

  pNew->nLTerm = mxTerm+1;
  for(i=0; i<=mxTerm; i++){
    if( pNew->aLTerm[i]==0 ){
      /* The non-zero argvIdx values must be contiguous.  Raise an
      ** error if they are not */
      sqlite3ErrorMsg(pParse,"%s.xBestIndex malfunction",pSrc->pTab->zName);
      testcase( pIdxInfo->needToFreeIdxStr );
      return SQLITE_ERROR;
    }
  }
  assert( pNew->nLTerm<=pNew->nLSlot );
  pNew->u.vtab.idxNum = pIdxInfo->idxNum;
  pNew->u.vtab.needFree = pIdxInfo->needToFreeIdxStr;
  pIdxInfo->needToFreeIdxStr = 0;
  pNew->u.vtab.idxStr = pIdxInfo->idxStr;
  pNew->u.vtab.isOrdered = (i8)(pIdxInfo->orderByConsumed ?
      pIdxInfo->nOrderBy : 0);
  pNew->rSetup = 0;
  pNew->rRun = sqlite3LogEstFromDouble(pIdxInfo->estimatedCost);
  pNew->nOut = sqlite3LogEst(pIdxInfo->estimatedRows);

  /* Set the WHERE_ONEROW flag if the xBestIndex() method indicated
  ** that the scan will visit at most one row. Clear it otherwise. */
  if( pIdxInfo->idxFlags & SQLITE_INDEX_SCAN_UNIQUE ){
    pNew->wsFlags |= WHERE_ONEROW;
  }else{
    pNew->wsFlags &= ~WHERE_ONEROW;
  }
  rc = whereLoopInsert(pBuilder, pNew);
  if( pNew->u.vtab.needFree ){
    sqlite3_free(pNew->u.vtab.idxStr);
    pNew->u.vtab.needFree = 0;
  }
  WHERETRACE(0xffffffff, ("  bIn=%d prereqIn=%04llx prereqOut=%04llx\n",
                      *pbIn, (sqlite3_uint64)mPrereq,
                      (sqlite3_uint64)(pNew->prereq & ~mPrereq)));

  return rc;
}